

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_iterator.hpp
# Opt level: O2

void __thiscall
burst::
merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::less<void>_>
::merge_iterator(merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::less<void>_>
                 *this,owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>
                       *first,
                owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>
                *last)

{
  compose_fn<burst::apply_fn<burst::invert_t<std::less<void>_>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>
  in_stack_ffffffffffffffa8;
  owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>
  local_50;
  owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>
  local_38;
  
  owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>
  ::owning_iterator(&this->m_begin,first);
  owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>
  ::owning_iterator(&this->m_end,last);
  remove_empty_ranges(this);
  owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>
  ::owning_iterator(&local_38,&this->m_begin);
  owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>
  ::owning_iterator(&local_50,&this->m_end);
  std::
  make_heap<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_List_iterator<int>,std::_Deque_iterator<int,int&,int*>>>,std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_List_iterator<int>,std::_Deque_iterator<int,int&,int*>>>>>>,burst::compose_fn<burst::apply_fn<burst::invert_t<std::less<void>>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>
            (&local_38,&local_50,in_stack_ffffffffffffffa8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.m_container.
              super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.m_container.
              super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

explicit merge_iterator (outer_range_iterator first, outer_range_iterator last, Compare compare = Compare()):
            m_begin(std::move(first)),
            m_end(std::move(last)),
            m_compare(compare)
        {
            // Чтобы провести эту проверку, внутренние диапазоны должны быть однонаправленными.
            // Подумать, как сделать эту проверку не требуя однонаправленности.
            // BOOST_ASSERT(std::all_of(m_begin, m_end,
            //     [& compare] (const auto & range)
            //     {
            //         return boost::algorithm::is_sorted(range, compare);
            //     }));

            remove_empty_ranges();
            std::make_heap(m_begin, m_end, each(front) | invert(m_compare));
        }